

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanContentCharList(QXmlStreamReaderPrivate *this)

{
  QString *this_00;
  qsizetype from;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long unaff_R15;
  long in_FS_OFFSET;
  QStringView s;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->textBuffer;
  lVar10 = 0;
LAB_003a60dc:
  do {
    lVar5 = (this->putStack).tos;
    if (lVar5 == -1) {
      lVar5 = this->readBufferPos;
      if (lVar5 < (this->readBuffer).d.size) {
        this->readBufferPos = lVar5 + 1;
        uVar2 = (uint)(ushort)(this->readBuffer).d.ptr[lVar5];
      }
      else {
        uVar2 = getChar_helper(this);
      }
    }
    else {
      uVar2 = 0xffffffff;
      if (this->atEnd == false) {
        uVar2 = (this->putStack).data[lVar5];
        (this->putStack).tos = lVar5 + -1;
      }
    }
    lVar5 = lVar10;
    if (uVar2 == 0xffffffff) goto LAB_003a654b;
    uVar3 = uVar2 & 0xffff;
    if (uVar3 < 0x20) {
      if (uVar3 < 10) {
        if (uVar3 == 9) goto LAB_003a63ce;
        if ((uVar2 & 0xffff) == 0) goto LAB_003a64e2;
LAB_003a61ac:
        if (uVar2 < 0x20) goto LAB_003a64e2;
        this->field_0x3a8 = this->field_0x3a8 & 0xfd;
        goto LAB_003a63ce;
      }
      if (uVar3 == 10) {
LAB_003a63b2:
        this->lineNumber = this->lineNumber + 1;
        this->lastLineStart = this->readBufferPos + this->characterOffset;
        goto LAB_003a63ce;
      }
      if (uVar3 != 0xd) goto LAB_003a61ac;
      lVar4 = (this->putStack).tos;
      if (lVar4 == -1) {
        if (this->readBufferPos < (this->readBuffer).d.size) {
          uVar3 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
        }
        else {
          uVar3 = getChar_helper(this);
          if (uVar3 == 0xffffffff) {
            uVar3 = 0xffffffff;
          }
          else {
            this->readBufferPos = this->readBufferPos + -1;
          }
        }
      }
      else {
        uVar3 = (this->putStack).data[lVar4];
      }
      if (uVar3 == 0xffffffff) {
        lVar4 = (this->putStack).tos;
        lVar9 = (this->putStack).cap;
        if (lVar4 + 1 < lVar9) {
LAB_003a6379:
          lVar4 = (this->putStack).tos;
          (this->putStack).tos = lVar4 + 1;
          (this->putStack).data[lVar4 + 1] = 0xd;
          uVar2 = 0;
          bVar1 = true;
          goto LAB_003a63aa;
        }
        lVar4 = lVar4 + 2;
        lVar8 = lVar9 * 2;
        if (lVar4 != lVar8 && SBORROW8(lVar4,lVar8) == lVar4 + lVar9 * -2 < 0) {
          lVar8 = lVar4;
        }
        (this->putStack).cap = lVar8;
        puVar6 = (uint *)realloc((this->putStack).data,lVar8 << 2);
        (this->putStack).data = puVar6;
        if (puVar6 != (uint *)0x0) goto LAB_003a6379;
LAB_003a656d:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          qBadAlloc();
        }
        goto LAB_003a6582;
      }
      uVar2 = 10;
      if (uVar3 == 10) {
        lVar4 = (this->putStack).tos;
        if (lVar4 == -1) {
          this->readBufferPos = this->readBufferPos + 1;
        }
        else {
          (this->putStack).tos = lVar4 + -1;
        }
      }
      bVar1 = false;
LAB_003a63aa:
      if (!bVar1) goto LAB_003a63b2;
      goto LAB_003a654b;
    }
    if (uVar3 < 0x3c) {
      if (uVar3 != 0x20) {
        if (uVar3 != 0x26) goto LAB_003a61ac;
        goto LAB_003a619f;
      }
LAB_003a63ce:
      QString::append(this_00,(QChar)(char16_t)uVar2);
      lVar10 = lVar10 + 1;
      goto LAB_003a60dc;
    }
    if (uVar3 == 0x3c) {
LAB_003a619f:
      if ((uVar2 & 0xff0000) != 0) goto LAB_003a61ac;
LAB_003a64e2:
      lVar10 = (this->putStack).tos;
      lVar4 = (this->putStack).cap;
      if (lVar4 <= lVar10 + 1) {
        lVar10 = lVar10 + 2;
        lVar9 = lVar4 * 2;
        if (lVar10 != lVar9 && SBORROW8(lVar10,lVar9) == lVar10 + lVar4 * -2 < 0) {
          lVar9 = lVar10;
        }
        (this->putStack).cap = lVar9;
        puVar6 = (uint *)realloc((this->putStack).data,lVar9 << 2);
        (this->putStack).data = puVar6;
        if (puVar6 == (uint *)0x0) goto LAB_003a656d;
      }
      lVar10 = (this->putStack).tos;
      (this->putStack).tos = lVar10 + 1;
      (this->putStack).data[lVar10 + 1] = uVar2;
      goto LAB_003a654b;
    }
    if (uVar3 - 0xfffe < 2) goto LAB_003a64e2;
    if (uVar3 != 0x5d) goto LAB_003a61ac;
    this->field_0x3a8 = this->field_0x3a8 & 0xfd;
    from = (this->textBuffer).d.size;
    do {
      QString::append(this_00,(QChar)(char16_t)uVar2);
      lVar5 = (this->putStack).tos;
      if (lVar5 == -1) {
        lVar5 = this->readBufferPos;
        if (lVar5 < (this->readBuffer).d.size) {
          this->readBufferPos = lVar5 + 1;
          uVar7 = (uint)(ushort)(this->readBuffer).d.ptr[lVar5];
        }
        else {
          uVar7 = getChar_helper(this);
        }
      }
      else {
        uVar7 = 0xffffffff;
        if (this->atEnd == false) {
          uVar7 = (this->putStack).data[lVar5];
          (this->putStack).tos = lVar5 + -1;
        }
      }
      lVar10 = lVar10 + 1;
      uVar2 = 0x5d;
    } while (uVar7 == 0x5d);
    if (uVar7 == 0x3e) {
      if ((this->textBuffer).d.ptr[(this->textBuffer).d.size + -2] != L']') goto LAB_003a6468;
      QCoreApplication::translate
                (&local_50,"QXmlStream","Sequence \']]>\' not allowed in content.",(char *)0x0,-1);
      this->error = NotWellFormedError;
      QString::operator=(&this->errorString,&local_50);
      this->type = Invalid;
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      bVar1 = false;
      unaff_R15 = lVar10;
    }
    else if (uVar7 == 0xffffffff) {
      s.m_data = (this->textBuffer).d.ptr;
      s.m_size = (this->textBuffer).d.size;
      putString(this,s,from);
      QString::resize(this_00,from);
      bVar1 = false;
      unaff_R15 = lVar10;
    }
    else {
LAB_003a6468:
      lVar5 = (this->putStack).tos;
      lVar4 = (this->putStack).cap;
      if (lVar4 <= lVar5 + 1) {
        lVar5 = lVar5 + 2;
        lVar9 = lVar4 * 2;
        if (lVar5 != lVar9 && SBORROW8(lVar5,lVar9) == lVar5 + lVar4 * -2 < 0) {
          lVar9 = lVar5;
        }
        (this->putStack).cap = lVar9;
        puVar6 = (uint *)realloc((this->putStack).data,lVar9 << 2);
        (this->putStack).data = puVar6;
        if (puVar6 == (uint *)0x0) goto LAB_003a656d;
      }
      lVar5 = (this->putStack).tos;
      (this->putStack).tos = lVar5 + 1;
      (this->putStack).data[lVar5 + 1] = uVar7;
      bVar1 = true;
    }
    lVar5 = unaff_R15;
    if (!bVar1) {
LAB_003a654b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return lVar5;
      }
LAB_003a6582:
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanContentCharList()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (ushort(c)) {
        case 0xfffe:
        case 0xffff:
        case 0:
            putChar(c);
            return n;
        case ']': {
            isWhitespace = false;
            const qsizetype pos = textBuffer.size();
            textBuffer += QChar(ushort(c));
            ++n;
            while ((c = getChar()) == ']') {
                textBuffer += QChar(ushort(c));
                ++n;
            }
            if (c == StreamEOF) {
                putString(textBuffer, pos);
                textBuffer.resize(pos);
            } else if (c == '>' && textBuffer.at(textBuffer.size() - 2) == u']') {
                raiseWellFormedError(QXmlStream::tr("Sequence ']]>' not allowed in content."));
            } else {
                putChar(c);
                break;
            }
            return n;
        } break;
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            textBuffer += QChar(ushort(c));
            ++n;
            break;
        case '&':
        case '<':
            if (!(c & 0xff0000)) {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            if (c < 0x20) {
                putChar(c);
                return n;
            }
            isWhitespace = false;
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }
    return n;
}